

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

char * Wlc_PrsFindSymbol(char *pStr,char Symb)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  bVar2 = true;
  while( true ) {
    cVar1 = *pStr;
    if (cVar1 == '\0') {
      return (char *)0x0;
    }
    if ((bool)(bVar2 & cVar1 == Symb)) break;
    bVar4 = cVar1 != '\\';
    bVar3 = cVar1 == ' ';
    if (!bVar4) {
      bVar3 = bVar4;
    }
    if (bVar2) {
      bVar3 = bVar4;
    }
    bVar2 = bVar3;
    pStr = pStr + 1;
  }
  return pStr;
}

Assistant:

static inline char * Wlc_PrsFindSymbol( char * pStr, char Symb )
{
    int fNotName = 1;
    for ( ; *pStr; pStr++ )
    {
        if ( fNotName && *pStr == Symb )
            return pStr;
        if ( pStr[0] == '\\' )
            fNotName = 0;
        else if ( !fNotName && *pStr == ' ' )
            fNotName = 1;
    }
    return NULL;
}